

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O2

void __thiscall ktx::ValidationContext::validateLevelIndex(ValidationContext *this)

{
  undefined2 uVar1;
  ktx_uint32_t kVar2;
  uint8_t blockByteLength;
  uint32_t uVar3;
  ktx_uint32_t kVar4;
  ulong uVar5;
  size_t sVar6;
  ktx_uint64_t kVar7;
  int iVar8;
  ulong uVar9;
  IssueError *issue;
  unsigned_long value;
  pointer pkVar10;
  ktx_uint64_t kVar11;
  long lVar12;
  uint32_t index;
  size_t expectedLength;
  unsigned_long expectedOffset;
  size_t requiredLevelAlignment;
  size_t local_38;
  
  std::vector<ktxLevelIndexEntry,_std::allocator<ktxLevelIndexEntry>_>::resize
            (&this->levelIndices,(ulong)this->numLevels);
  lVar12 = (ulong)this->numLevels * 0x18;
  (*this->_vptr_ValidationContext[2])
            (this,0x50,
             (this->levelIndices).
             super__Vector_base<ktxLevelIndexEntry,_std::allocator<ktxLevelIndexEntry>_>._M_impl.
             super__Vector_impl_data._M_start,lVar12,0xf,"the level index");
  if ((this->expectedBytePlanes).super__Optional_base<std::array<unsigned_char,_8UL>,_true,_true>.
      _M_payload.super__Optional_payload_base<std::array<unsigned_char,_8UL>_>._M_engaged == true) {
    blockByteLength =
         (this->expectedBytePlanes).super__Optional_base<std::array<unsigned_char,_8UL>,_true,_true>
         ._M_payload.super__Optional_payload_base<std::array<unsigned_char,_8UL>_>._M_payload.
         _M_value._M_elems[0];
  }
  else {
    uVar1 = this->parsedBlockByteLength;
    blockByteLength = '\0';
    if ((this->parsedBlockByteLength).super__Optional_base<unsigned_char,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_char>._M_engaged != false) {
      blockByteLength = (char)uVar1 + ((char)uVar1 == '\0');
    }
  }
  uVar3 = calcLevelAlignment((this->header).supercompressionScheme,blockByteLength);
  requiredLevelAlignment = (size_t)uVar3;
  kVar11 = (this->header).supercompressionGlobalData.byteLength;
  if (kVar11 == 0) {
    kVar2 = (this->header).keyValueData.byteLength;
    if (kVar2 == 0) {
      kVar2 = (this->header).dataFormatDescriptor.byteLength;
      if (kVar2 == 0) {
        value = lVar12 + 0x50;
      }
      else {
        value = (unsigned_long)(kVar2 + (this->header).dataFormatDescriptor.byteOffset);
      }
    }
    else {
      value = (unsigned_long)(kVar2 + (this->header).keyValueData.byteOffset);
    }
  }
  else {
    value = kVar11 + (this->header).supercompressionGlobalData.byteOffset;
  }
  local_38 = align<unsigned_long>(value,requiredLevelAlignment);
  expectedOffset = 1;
  while( true ) {
    sVar6 = local_38;
    pkVar10 = (this->levelIndices).
              super__Vector_base<ktxLevelIndexEntry,_std::allocator<ktxLevelIndexEntry>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar5 = ((long)(this->levelIndices).
                   super__Vector_base<ktxLevelIndexEntry,_std::allocator<ktxLevelIndexEntry>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)pkVar10) / 0x18;
    if (uVar5 <= expectedOffset) break;
    sVar6 = expectedOffset - 1;
    if (pkVar10[expectedOffset - 1].uncompressedByteLength <
        pkVar10[expectedOffset].uncompressedByteLength) {
      expectedLength = sVar6;
      error<unsigned_long,unsigned_long&,unsigned_long&,unsigned_long&>
                (this,&LevelIndex::IncorrectIndexOrder,&expectedLength,
                 &pkVar10[expectedOffset - 1].uncompressedByteLength,&expectedOffset,
                 &pkVar10[expectedOffset].uncompressedByteLength);
      pkVar10 = (this->levelIndices).
                super__Vector_base<ktxLevelIndexEntry,_std::allocator<ktxLevelIndexEntry>_>._M_impl.
                super__Vector_impl_data._M_start;
      sVar6 = expectedOffset - 1;
    }
    if (pkVar10[sVar6].byteOffset < pkVar10[expectedOffset].byteOffset) {
      expectedLength = sVar6;
      error<unsigned_long,unsigned_long&,unsigned_long&,unsigned_long&>
                (this,&LevelIndex::IncorrectLevelOrder,&expectedLength,&pkVar10[sVar6].byteOffset,
                 &expectedOffset,&pkVar10[expectedOffset].byteOffset);
    }
    expectedOffset = expectedOffset + 1;
  }
  uVar5 = uVar5 & 0xffffffff;
  kVar7 = 0;
  kVar11 = local_38;
  do {
    uVar5 = uVar5 - 1;
    if (uVar5 == 0xffffffffffffffff) {
      return;
    }
    index = (uint32_t)uVar5;
    pkVar10 = (this->levelIndices).
              super__Vector_base<ktxLevelIndexEntry,_std::allocator<ktxLevelIndexEntry>_>._M_impl.
              super__Vector_impl_data._M_start + (uVar5 & 0xffffffff);
    if (((this->header).vkFormat == 0) || ((this->header).supercompressionScheme != 0)) {
      expectedOffset = align<unsigned_long>(kVar11 + kVar7,requiredLevelAlignment);
    }
    else {
      expectedOffset = calcLevelOffset(this,sVar6,requiredLevelAlignment,index);
    }
    if (pkVar10->byteOffset % requiredLevelAlignment == 0) {
      if (pkVar10->byteOffset != expectedOffset) {
        error<unsigned_int_const&,unsigned_long_const&,unsigned_long_const&>
                  (this,&LevelIndex::IncorrectByteOffset,&index,&pkVar10->byteOffset,&expectedOffset
                  );
      }
    }
    else {
      error<unsigned_int_const&,unsigned_long_const&,unsigned_long&,unsigned_long_const&>
                (this,&LevelIndex::IncorrectByteOffsetUnaligned,&index,&pkVar10->byteOffset,
                 &requiredLevelAlignment,&expectedOffset);
    }
    kVar2 = (this->header).vkFormat;
    if (kVar2 + 0xc460d100 < 0x1e) {
      uVar9 = (ulong)((this->expectedBlockDimension2).
                      super__Optional_base<unsigned_char,_true,_true>._M_payload.
                      super__Optional_payload_base<unsigned_char>._M_payload._M_value + 1);
      if ((this->expectedBlockDimension2).super__Optional_base<unsigned_char,_true,_true>._M_payload
          .super__Optional_payload_base<unsigned_char>._M_engaged == false) {
        uVar9 = 1;
      }
      if ((int)((ulong)(this->header).pixelDepth % uVar9) == 0) goto LAB_0018935c;
    }
    else {
LAB_0018935c:
      kVar4 = (this->header).supercompressionScheme;
      if (kVar4 == 0 && kVar2 != 0) {
        expectedLength = calcLevelSize(this,index);
        if (pkVar10->byteLength != expectedLength) {
          error<unsigned_int_const&,unsigned_long_const&,unsigned_long_const&>
                    (this,&LevelIndex::IncorrectByteLength,&index,&pkVar10->byteLength,
                     &expectedLength);
        }
        kVar4 = (this->header).supercompressionScheme;
      }
      if (kVar4 == 1) {
        if (pkVar10->uncompressedByteLength != 0) {
          issue = &LevelIndex::NonZeroUBLForBLZE;
LAB_001893c7:
          error<unsigned_int_const&,unsigned_long_const&>
                    (this,issue,&index,&pkVar10->uncompressedByteLength);
        }
      }
      else if ((this->header).vkFormat == 0) {
        if (pkVar10->uncompressedByteLength == 0) {
          error<unsigned_int_const&>(this,&LevelIndex::ZeroUncompressedLength,&index);
        }
        else {
          iVar8 = this->numLayers * (this->header).faceCount;
          if (pkVar10->uncompressedByteLength % (ulong)(iVar8 + (uint)(iVar8 == 0)) != 0) {
            issue = &LevelIndex::InvalidUncompressedLength;
            goto LAB_001893c7;
          }
        }
      }
      else if (kVar4 == 0) {
        expectedLength = calcLevelSize(this,index);
        if (pkVar10->uncompressedByteLength != expectedLength) {
          error<unsigned_int_const&,unsigned_long_const&,unsigned_long_const&>
                    (this,&LevelIndex::IncorrectUncompressedByteLength,&index,
                     &pkVar10->uncompressedByteLength,&expectedLength);
        }
      }
    }
    kVar11 = pkVar10->byteOffset;
    kVar7 = pkVar10->byteLength;
  } while( true );
}

Assistant:

void ValidationContext::validateLevelIndex() {
    levelIndices.resize(numLevels);

    const auto levelIndexOffset = sizeof(KTX_header2);
    const auto levelIndexSize = sizeof(ktxLevelIndexEntry) * numLevels;
    read(levelIndexOffset, levelIndices.data(), levelIndexSize, "the level index");

    const auto blockByteLength = (expectedBytePlanes ? expectedBytePlanes->at(0) : (parsedBlockByteLength == 0 ? uint8_t(1) : parsedBlockByteLength.value_or(0)));
    std::size_t requiredLevelAlignment = calcLevelAlignment(ktxSupercmpScheme(header.supercompressionScheme), blockByteLength);

    std::size_t expectedFirstLevelOffset = 0;
    if (header.supercompressionGlobalData.byteLength != 0)
        expectedFirstLevelOffset = header.supercompressionGlobalData.byteLength + header.supercompressionGlobalData.byteOffset;
    else if (header.keyValueData.byteLength != 0)
        expectedFirstLevelOffset = header.keyValueData.byteLength + header.keyValueData.byteOffset;
    else if (header.dataFormatDescriptor.byteLength != 0)
        expectedFirstLevelOffset = header.dataFormatDescriptor.byteLength + header.dataFormatDescriptor.byteOffset;
    else
        expectedFirstLevelOffset = levelIndexOffset + levelIndexSize;
    expectedFirstLevelOffset = align(expectedFirstLevelOffset, requiredLevelAlignment);

    // The first (largest) mip level is the first in the index and the last in the file.
    for (std::size_t i = 1; i < levelIndices.size(); ++i) {
        if (levelIndices[i].uncompressedByteLength > levelIndices[i - 1].uncompressedByteLength)
            error(LevelIndex::IncorrectIndexOrder, i - 1, levelIndices[i - 1].uncompressedByteLength, i, levelIndices[i].uncompressedByteLength);

        if (levelIndices[i].byteOffset > levelIndices[i - 1].byteOffset)
            error(LevelIndex::IncorrectLevelOrder, i - 1, levelIndices[i - 1].byteOffset, i, levelIndices[i].byteOffset);
    }

    std::size_t lastByteOffset = expectedFirstLevelOffset; // Reuse lastByteOffset to inject first offset to expectedOffset
    std::size_t lastByteLength = 0;

    // Count down, so we can check the distance between levels for the UNDEFINED and SUPERCOMPRESSION cases.
    for (auto it = static_cast<uint32_t>(levelIndices.size()); it != 0; --it) {
        const auto index = it - 1;
        const auto& level = levelIndices[index];

        // Validate byteOffset
        const auto knownLevelOffset = header.vkFormat != VK_FORMAT_UNDEFINED &&
                header.supercompressionScheme == KTX_SS_NONE;
        // If the exact level sizes are unknown we have to trust the byteLengths.
        // In that case we know where the first level must be in the file, and we can calculate
        // the offsets by progressively summing the lengths and paddings so far.
        const auto expectedOffset = knownLevelOffset ?
                calcLevelOffset(expectedFirstLevelOffset, requiredLevelAlignment, index) :
                align(lastByteOffset + lastByteLength, requiredLevelAlignment);

        if (level.byteOffset % requiredLevelAlignment != 0)
            error(LevelIndex::IncorrectByteOffsetUnaligned, index, level.byteOffset, requiredLevelAlignment, expectedOffset);
        else if (level.byteOffset != expectedOffset)
            error(LevelIndex::IncorrectByteOffset, index, level.byteOffset, expectedOffset);

        // Workaround: Disable ByteLength validations for the 3D ASTC encoder which currently ignores partial Z blocks in our test files
        const auto disableByteLengthValidation = isFormat3DBlockCompressed(VkFormat(header.vkFormat))
                && header.pixelDepth % (expectedBlockDimension2.value_or(0) + 1) != 0;

        if (!disableByteLengthValidation) {
            // Validate byteLength
            if (header.vkFormat != VK_FORMAT_UNDEFINED && header.supercompressionScheme == KTX_SS_NONE) {
                const auto expectedLength = calcLevelSize(index);
                if (level.byteLength != expectedLength)
                    error(LevelIndex::IncorrectByteLength, index, level.byteLength, expectedLength);
            }

            // Validate uncompressedByteLength
            if (header.supercompressionScheme == KTX_SS_BASIS_LZ) {
                if (level.uncompressedByteLength != 0)
                    error(LevelIndex::NonZeroUBLForBLZE, index, level.uncompressedByteLength);
            } else if (header.vkFormat != VK_FORMAT_UNDEFINED) {
                if (header.supercompressionScheme == KTX_SS_NONE) {
                    const auto expectedUncompressedLength = calcLevelSize(index);
                    if (level.uncompressedByteLength != expectedUncompressedLength)
                        error(LevelIndex::IncorrectUncompressedByteLength, index, level.uncompressedByteLength, expectedUncompressedLength);
                }
            } else {
                if (level.uncompressedByteLength == 0)
                    error(LevelIndex::ZeroUncompressedLength, index);
                else if (level.uncompressedByteLength % std::max(header.faceCount * numLayers, 1u) != 0)
                    // On the other branches uncompressedByteLength is always checked exactly,
                    // so this is the only branch where this checks yields useful information
                    error(LevelIndex::InvalidUncompressedLength, index, level.uncompressedByteLength);
            }
        }

        lastByteOffset = level.byteOffset;
        lastByteLength = level.byteLength;
    }
}